

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

string * __thiscall
kratos::VarCasted::to_string_abi_cxx11_(string *__return_storage_ptr__,VarCasted *this)

{
  Enum *pEVar1;
  UserException *this_00;
  _Alloc_hider _Var2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  pointer *****local_78;
  size_type sStack_70;
  string local_68;
  pointer *****local_48;
  size_type sStack_40;
  pointer *****local_38 [2];
  
  switch(this->cast_type_) {
  case Signed:
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_68);
    local_48 = (pointer *****)local_68._M_dataplus._M_p;
    sStack_40 = local_68._M_string_length;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0xc;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)0x2488fa,format_str,args);
    break;
  case Unsigned:
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_68);
    local_48 = (pointer *****)local_68._M_dataplus._M_p;
    sStack_40 = local_68._M_string_length;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0xe;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_48;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"unsigned\'({0})",format_str_01,args_01);
    break;
  default:
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(__return_storage_ptr__);
    return __return_storage_ptr__;
  case Enum:
    pEVar1 = this->enum_type_;
    if (pEVar1 == (Enum *)0x0) {
      this_00 = (UserException *)__cxa_allocate_exception(0x10);
      (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_48);
      local_78 = local_48;
      sStack_70 = sStack_40;
      format_str_03.size_ = 0xd;
      format_str_03.data_ = (char *)0x3e;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_03.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_78;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_68,
                 (detail *)"Variable {0} is casted as a enum without enum type information",
                 format_str_03,args_03);
      UserException::UserException(this_00,&local_68);
      __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_48);
    local_68._M_dataplus._M_p = (pEVar1->name)._M_dataplus._M_p;
    local_68._M_string_length = (pEVar1->name)._M_string_length;
    local_68.field_2._M_allocated_capacity = (size_type)local_48;
    local_68.field_2._8_8_ = sStack_40;
    format_str_00.size_ = 0xdd;
    format_str_00.data_ = (char *)0x9;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"{0}\'({1})",format_str_00,args_00);
    goto LAB_0018e55c;
  case Resize:
    (*(this->parent_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_48);
    local_68._M_dataplus._M_p = (pointer)(ulong)this->target_width_;
    local_68.field_2._M_allocated_capacity = (size_type)local_48;
    local_68.field_2._8_8_ = sStack_40;
    format_str_02.size_ = 0xd2;
    format_str_02.data_ = (char *)0x9;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_02.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"{0}\'({1})",format_str_02,args_02);
LAB_0018e55c:
    _Var2._M_p = (pointer)local_48;
    if ((pointer ******)local_48 == local_38) {
      return __return_storage_ptr__;
    }
    goto LAB_0018e56d;
  }
  local_38[0] = (pointer *****)local_68.field_2._M_allocated_capacity;
  _Var2._M_p = local_68._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_0018e56d:
    operator_delete(_Var2._M_p,(long)local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VarCasted::to_string() const {
    if (cast_type_ == VarCastType::Signed) {
        return ::format("signed'({0})", parent_var_->to_string());
    } else if (cast_type_ == VarCastType::Unsigned) {
        return ::format("unsigned'({0})", parent_var_->to_string());
    } else if (cast_type_ == VarCastType::Enum) {
        if (!enum_type_) {
            throw UserException(
                ::format("Variable {0} is casted as a enum without "
                         "enum type information",
                         parent_var_->to_string()));
        }
        auto const &enum_name = enum_type_->name;
        return ::format("{0}'({1})", enum_name, parent_var_->to_string());
    } else if (cast_type_ == VarCastType::Resize) {
        return ::format("{0}'({1})", target_width_, parent_var_->to_string());
    } else {
        return parent_var_->to_string();
    }
}